

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiWindow * ImGui::GetTopMostPopupModal(void)

{
  uint uVar1;
  bool bVar2;
  ImGuiWindow *pIVar3;
  ImGuiWindow *pIVar4;
  int iVar5;
  long lVar6;
  
  uVar1 = (GImGui->OpenPopupStack).Size;
  iVar5 = uVar1 + 1;
  lVar6 = (long)(ulong)uVar1 * 0x30 + -0x28;
  pIVar3 = (ImGuiWindow *)(ulong)uVar1;
  do {
    iVar5 = iVar5 + -1;
    if (iVar5 < 1) {
      return (ImGuiWindow *)0x0;
    }
    pIVar4 = *(ImGuiWindow **)((long)&((GImGui->OpenPopupStack).Data)->PopupId + lVar6);
    if ((pIVar4 == (ImGuiWindow *)0x0) || ((pIVar4->Flags & 0x8000000) == 0)) {
      bVar2 = true;
      pIVar4 = pIVar3;
    }
    else {
      bVar2 = false;
    }
    lVar6 = lVar6 + -0x30;
    pIVar3 = pIVar4;
  } while (bVar2);
  return pIVar4;
}

Assistant:

ImGuiWindow* ImGui::GetTopMostPopupModal()
{
    ImGuiContext& g = *GImGui;
    for (int n = g.OpenPopupStack.Size - 1; n >= 0; n--)
        if (ImGuiWindow* popup = g.OpenPopupStack.Data[n].Window)
            if (popup->Flags & ImGuiWindowFlags_Modal)
                return popup;
    return NULL;
}